

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

AtomSpan __thiscall Potassco::SmodelsConvert::SmData::mapHead(SmData *this,AtomSpan *h)

{
  Atom AVar1;
  pointer puVar2;
  iterator iVar3;
  pointer puVar4;
  Atom *pAVar5;
  pointer puVar6;
  Atom_t *pAVar7;
  AtomSpan AVar8;
  uint local_30;
  uint local_2c;
  
  puVar2 = (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  if (h->size != 0) {
    pAVar7 = h->first;
    do {
      pAVar5 = mapAtom(this,*pAVar7);
      AVar1 = *pAVar5;
      *pAVar5 = (Atom)((uint)AVar1 | 0x10000000);
      local_2c = (uint)AVar1 & 0xfffffff;
      iVar3._M_current =
           (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&this->head_,iVar3,&local_2c);
      }
      else {
        *iVar3._M_current = local_2c;
        (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      pAVar7 = pAVar7 + 1;
    } while (pAVar7 != h->first + h->size);
  }
  iVar3._M_current =
       (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start == iVar3._M_current) {
    local_30 = 1;
    if (iVar3._M_current ==
        (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&this->head_,iVar3,&local_30);
    }
    else {
      *iVar3._M_current = 1;
      (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
  }
  puVar2 = (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar6 = (pointer)((long)puVar4 - (long)puVar2 >> 2);
  if (puVar4 == puVar2) {
    puVar6 = (pointer)0x0;
    puVar2 = (pointer)0x0;
  }
  AVar8.size = (size_t)puVar6;
  AVar8.first = puVar2;
  return AVar8;
}

Assistant:

AtomSpan SmodelsConvert::SmData::mapHead(const AtomSpan& h) {
	head_.clear();
	for (const Atom_t* x = begin(h); x != end(h); ++x) {
		head_.push_back(mapHeadAtom(*x));
	}
	if (head_.empty()) { head_.push_back(falseAtom()); }
	return toSpan(head_);
}